

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

int compute_codewords(Codebook *c,uint8 *len,int n,uint32 *values)

{
  uint8 uVar1;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  uint32 uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 auStack_88 [8];
  uint32 available [32];
  
  available[0xe] = 0;
  available[0xf] = 0;
  available[0x10] = 0;
  available[0x11] = 0;
  available[10] = 0;
  available[0xb] = 0;
  available[0xc] = 0;
  available[0xd] = 0;
  available[6] = 0;
  available[7] = 0;
  available[8] = 0;
  available[9] = 0;
  available[2] = 0;
  available[3] = 0;
  available[4] = 0;
  available[5] = 0;
  _auStack_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  if (n < 1) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    do {
      if (len[uVar9] != 0xff) goto LAB_00194ccd;
      uVar9 = uVar9 + 1;
    } while ((uint)n != uVar9);
    uVar9 = (ulong)(uint)n;
  }
LAB_00194ccd:
  uVar8 = (uint32)uVar9;
  if (uVar8 != n) {
    uVar9 = uVar9 & 0xffffffff;
    if (c->sparse == '\0') {
      c->codewords[uVar9] = 0;
    }
    else {
      uVar1 = len[uVar9];
      *c->codewords = 0;
      *c->codeword_lengths = uVar1;
      *values = uVar8;
    }
    bVar4 = len[uVar9];
    if ((ulong)bVar4 != 0) {
      lVar5 = (ulong)bVar4 - 1;
      auVar14._8_4_ = (int)lVar5;
      auVar14._0_8_ = lVar5;
      auVar14._12_4_ = (int)((ulong)lVar5 >> 0x20);
      bVar6 = 0x1e;
      uVar9 = 0;
      auVar14 = auVar14 ^ _DAT_0019d2d0;
      do {
        auVar15._8_4_ = (int)uVar9;
        auVar15._0_8_ = uVar9;
        auVar15._12_4_ = (int)(uVar9 >> 0x20);
        auVar15 = (auVar15 | _DAT_0019d2c0) ^ _DAT_0019d2d0;
        if ((bool)(~(auVar15._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar15._0_4_ ||
                    auVar14._4_4_ < auVar15._4_4_) & 1)) {
          *(uint *)(local_b8 + uVar9 * 4 + 4) = 0x80000000 >> ((byte)uVar9 & 0x1f);
        }
        if ((auVar15._12_4_ != auVar14._12_4_ || auVar15._8_4_ <= auVar14._8_4_) &&
            auVar15._12_4_ <= auVar14._12_4_) {
          *(int *)(local_b8 + uVar9 * 4 + 8) = 1 << (bVar6 & 0x1f);
        }
        uVar9 = uVar9 + 2;
        bVar6 = bVar6 - 2;
      } while ((bVar4 + 1 & 0xfffffffe) != uVar9);
    }
    if ((int)(uVar8 + 1) < n) {
      uVar9 = (ulong)(uVar8 + 1);
      iVar7 = 1;
      do {
        bVar4 = len[uVar9];
        uVar11 = (uint)bVar4;
        if (uVar11 == 0xff) {
          iVar13 = 10;
        }
        else {
          if (bVar4 != 0) {
            do {
              if (*(int *)(local_b8 + (ulong)uVar11 * 4) != 0) goto LAB_00194e18;
              bVar3 = 1 < (int)uVar11;
              uVar11 = uVar11 - 1;
            } while (bVar3);
            uVar11 = 0;
          }
LAB_00194e18:
          if (uVar11 == 0) {
            iVar13 = 1;
          }
          else {
            uVar2 = *(uint *)(local_b8 + (ulong)uVar11 * 4);
            *(undefined4 *)(local_b8 + (ulong)uVar11 * 4) = 0;
            uVar12 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
            ;
            uVar12 = (uVar12 & 0xf0f0f0f) << 4 | uVar12 >> 4 & 0xf0f0f0f;
            uVar12 = (uVar12 >> 2 & 0x33333333) + (uVar12 & 0x33333333) * 4;
            uVar8 = (uVar12 >> 1 & 0x55555555) + (uVar12 & 0x55555555) * 2;
            if (c->sparse == '\0') {
              c->codewords[uVar9] = uVar8;
            }
            else {
              c->codewords[iVar7] = uVar8;
              c->codeword_lengths[iVar7] = bVar4;
              values[iVar7] = (uint32)uVar9;
            }
            iVar7 = iVar7 + 1;
            bVar4 = len[uVar9];
            uVar10 = (ulong)bVar4;
            iVar13 = 0;
            if ((int)uVar11 < (int)(uint)bVar4) {
              bVar4 = 0x20 - bVar4;
              do {
                *(uint *)(local_b8 + uVar10 * 4) = (1 << (bVar4 & 0x1f)) + uVar2;
                uVar12 = (int)uVar10 - 1;
                uVar10 = (ulong)uVar12;
                bVar4 = bVar4 + 1;
              } while ((int)uVar11 < (int)uVar12);
            }
          }
        }
        if ((iVar13 != 10) && (iVar13 != 0)) {
          return 0;
        }
        uVar9 = uVar9 + 1;
      } while ((int)uVar9 < n);
    }
  }
  return 1;
}

Assistant:

static int compute_codewords(Codebook *c, uint8 *len, int n, uint32 *values)
{
   int i,k,m=0;
   uint32 available[32];

   memset(available, 0, sizeof(available));
   // find the first entry
   for (k=0; k < n; ++k) if (len[k] < NO_CODE) break;
   if (k == n) { assert(c->sorted_entries == 0); return TRUE; }
   assert(len[k] < 32); // no error return required, code reading lens checks this
   // add to the list
   add_entry(c, 0, k, m++, len[k], values);
   // add all available leaves
   for (i=1; i <= len[k]; ++i)
      available[i] = 1U << (32-i);
   // note that the above code treats the first case specially,
   // but it's really the same as the following code, so they
   // could probably be combined (except the initial code is 0,
   // and I use 0 in available[] to mean 'empty')
   for (i=k+1; i < n; ++i) {
      uint32 res;
      int z = len[i], y;
      if (z == NO_CODE) continue;
      assert(z < 32); // no error return required, code reading lens checks this
      // find lowest available leaf (should always be earliest,
      // which is what the specification calls for)
      // note that this property, and the fact we can never have
      // more than one free leaf at a given level, isn't totally
      // trivial to prove, but it seems true and the assert never
      // fires, so!
      while (z > 0 && !available[z]) --z;
      if (z == 0) { return FALSE; }
      res = available[z];
      available[z] = 0;
      add_entry(c, bit_reverse(res), i, m++, len[i], values);
      // propagate availability up the tree
      if (z != len[i]) {
         for (y=len[i]; y > z; --y) {
            assert(available[y] == 0);
            available[y] = res + (1 << (32-y));
         }
      }
   }
   return TRUE;
}